

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexerScanner.cpp
# Opt level: O0

void __thiscall LexerScanner::LexerScanner(LexerScanner *this,FILE *fp)

{
  char *pcVar1;
  ulong uVar2;
  size_t local_38;
  long bytes;
  long fsize;
  FILE *local_18;
  FILE *fp_local;
  LexerScanner *this_local;
  
  local_18 = (FILE *)fp;
  fp_local = (FILE *)this;
  String::String(&this->m_tokenText);
  String::String(&this->m_lastToken);
  this->m_line = 1;
  fseek(local_18,0,2);
  bytes = ftell(local_18);
  rewind(local_18);
  uVar2 = bytes + 1;
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  this->m_data = pcVar1;
  this->m_lineBreakPosition = this->m_data;
  this->m_position = this->m_data;
  local_38 = fread(this->m_data,1,bytes,local_18);
  this->m_data[bytes] = '\0';
  if ((long)local_38 < bytes) {
    error<long,long>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexerScanner.cpp:135: bytes (%1) is not at least fsize (%2)"
                     ,(long *)&local_38,&bytes);
  }
  return;
}

Assistant:

LexerScanner::LexerScanner (FILE* fp) :
	m_line (1)
{
	long fsize, bytes;

	fseek (fp, 0l, SEEK_END);
	fsize = ftell (fp);
	rewind (fp);
	m_data = new char[fsize + 1];
	m_position = m_lineBreakPosition = &m_data[0];
	bytes = fread (m_data, 1, fsize, fp);
	m_data[fsize] = '\0';
	ASSERT_GT_EQ (bytes, fsize)
}